

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomreg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  ull uVar1;
  int iVar2;
  void *pvVar3;
  reg *in_RDX;
  ull *in_RSI;
  ull *in_RDI;
  int in_R8D;
  expr *expr;
  matches *res;
  reg *reg;
  undefined4 in_stack_00000018;
  int in_stack_00000074;
  expr *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  etype type;
  disctx *in_stack_fffffffffffffff8;
  matches *__ptr;
  
  type = (etype)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if ((int)in_RDI[9] == 0) {
    local_48 = printreg(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
    if (local_48 == (expr *)0x0) {
      local_48 = makeex(type);
    }
    if (*(int *)((long)in_RDI + 0x74) <= (int)in_RDI[0xe]) {
      if (*(int *)((long)in_RDI + 0x74) == 0) {
        *(undefined4 *)((long)in_RDI + 0x74) = 0x10;
      }
      else {
        *(int *)((long)in_RDI + 0x74) = *(int *)((long)in_RDI + 0x74) << 1;
      }
      pvVar3 = realloc((void *)in_RDI[0xd],(long)*(int *)((long)in_RDI + 0x74) << 3);
      in_RDI[0xd] = (ull)pvVar3;
    }
    uVar1 = in_RDI[0xe];
    *(int *)(in_RDI + 0xe) = (int)uVar1 + 1;
    *(expr **)(in_RDI[0xd] + (long)(int)uVar1 * 8) = local_48;
    __ptr = (matches *)0x0;
  }
  else if (in_R8D == *(int *)(in_RDI[10] + 0x18)) {
    __ptr = (matches *)0x0;
  }
  else {
    __ptr = alwaysmatches(in_stack_00000074);
    iVar2 = matchreg((match *)CONCAT44(spos,in_stack_00000018),reg,(expr *)res,(disctx *)expr);
    if (iVar2 == 0) {
      free(__ptr->m);
      free(__ptr);
      __ptr = (matches *)0x0;
    }
  }
  return __ptr;
}

Assistant:

struct matches *atomreg APROTO {
	const struct reg *reg = v;
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct matches *res = alwaysmatches(spos+1);
		if (matchreg(res->m, reg, ctx->line->atoms[spos], ctx))
			return res;
		else {
			free(res->m);
			free(res);
			return 0;
		}
	}
	struct expr *expr = printreg(ctx, a, m, reg);
	if (!expr) expr = makeex(EXPR_NUM);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}